

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathexpander.cpp
# Opt level: O1

FileReader * __thiscall PathExpander::openFileReader(PathExpander *this,char *name,int *plumpnum)

{
  long lVar1;
  bool bVar2;
  int lump;
  FWadLump *this_00;
  long lVar3;
  FWadLump *unaff_R12;
  FWadLump *pFVar4;
  FString current_filename;
  FString local_40;
  FString local_38;
  
  local_40.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  if ((name != (char *)0x0) && (*name != '\0')) {
    FString::operator=(&local_40,name);
    FString::ReplaceChars(&local_40,'\\','/');
    if (this->openmode != 2) {
      lump = FWadCollection::CheckNumForFullName(&Wads,local_40.Chars,false,0);
      if (lump < 0) {
        if (this->openmode == 1) {
          lVar3 = (ulong)(this->PathList).Count * 8 + -8;
          do {
            if (lVar3 + -8 == -0x10) {
              unaff_R12 = (FWadLump *)0x0;
              goto LAB_003aa770;
            }
            BuildPath(&local_38,(char *)((long)&((this->PathList).Array)->Chars + lVar3));
            FString::operator=(&local_40,&local_38);
            FString::~FString(&local_38);
            lump = FWadCollection::CheckNumForFullName(&Wads,local_40.Chars,false,0);
            lVar3 = lVar3 + -8;
          } while (lump < 0);
          unaff_R12 = FWadCollection::ReopenLumpNum(&Wads,lump);
          goto LAB_003aa765;
        }
        bVar2 = true;
      }
      else {
        unaff_R12 = FWadCollection::ReopenLumpNum(&Wads,lump);
LAB_003aa765:
        if (plumpnum != (int *)0x0) {
          *plumpnum = lump;
        }
LAB_003aa770:
        bVar2 = false;
      }
      pFVar4 = unaff_R12;
      if (!bVar2) goto LAB_003aa81d;
    }
    if (plumpnum != (int *)0x0) {
      *plumpnum = -1;
    }
    this_00 = (FWadLump *)operator_new(0x30);
    FileReader::FileReader((FileReader *)this_00);
    bVar2 = FileReader::Open((FileReader *)this_00,local_40.Chars);
    pFVar4 = this_00;
    if (bVar2) goto LAB_003aa81d;
    if (*name != '/') {
      lVar3 = (ulong)(this->PathList).Count * 8 + -8;
      do {
        lVar1 = lVar3 + -8;
        pFVar4 = unaff_R12;
        if (lVar1 == -0x10) break;
        BuildPath(&local_38,(char *)((long)&((this->PathList).Array)->Chars + lVar3));
        FString::operator=(&local_40,&local_38);
        FString::~FString(&local_38);
        bVar2 = FileReader::Open((FileReader *)this_00,local_40.Chars);
        lVar3 = lVar1;
        pFVar4 = this_00;
      } while (!bVar2);
      if (lVar1 != -0x10) goto LAB_003aa81d;
    }
    (*(this_00->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[1])(this_00);
  }
  pFVar4 = (FWadLump *)0x0;
LAB_003aa81d:
  FString::~FString(&local_40);
  return &pFVar4->super_FileReader;
}

Assistant:

void PathExpander::clearPathlist()
{
	PathList.Clear();
}